

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Optimisations.h
# Opt level: O0

InlineResult
soul::Optimisations::inlineNextCall
          (Program *program,Function *parentFunction,Function *functionToInline)

{
  bool bVar1;
  LinkedList<soul::heart::Statement> *pLVar2;
  reference this;
  Block *pBVar3;
  Iterator other;
  FunctionCall *pFVar4;
  pool_ptr<soul::heart::FunctionCall> local_60;
  pool_ptr<soul::heart::FunctionCall> call;
  Statement *s;
  Iterator __end3;
  Iterator __begin3;
  LinkedList<soul::heart::Statement> *__range3;
  size_t blockIndex;
  Function *functionToInline_local;
  Function *parentFunction_local;
  Program *program_local;
  
  __range3 = (LinkedList<soul::heart::Statement> *)0x0;
  do {
    pLVar2 = (LinkedList<soul::heart::Statement> *)
             std::
             vector<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
             ::size(&parentFunction->blocks);
    if (pLVar2 <= __range3) {
      return noneFound;
    }
    this = std::
           vector<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
           ::operator[](&parentFunction->blocks,(size_type)__range3);
    pBVar3 = pool_ref<soul::heart::Block>::operator->(this);
    __end3 = LinkedList<soul::heart::Statement>::begin(&pBVar3->statements);
    other = LinkedList<soul::heart::Statement>::end();
    while (bVar1 = LinkedList<soul::heart::Statement>::Iterator::operator!=(&__end3,other), bVar1) {
      call.object = (FunctionCall *)LinkedList<soul::heart::Statement>::Iterator::operator*(&__end3)
      ;
      cast<soul::heart::FunctionCall,soul::heart::Statement>
                ((soul *)&local_60,(Statement *)call.object);
      bVar1 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&local_60);
      if (bVar1) {
        pFVar4 = pool_ptr<soul::heart::FunctionCall>::operator->(&local_60);
        bVar1 = pool_ptr<soul::heart::Function>::operator==(&pFVar4->function,functionToInline);
        if (!bVar1) goto LAB_00525e63;
        pFVar4 = pool_ptr<soul::heart::FunctionCall>::operator*(&local_60);
        bVar1 = heart::Utilities::canFunctionBeInlined(program,parentFunction,pFVar4);
        if (bVar1) {
          pFVar4 = pool_ptr<soul::heart::FunctionCall>::operator*(&local_60);
          makeFunctionCallInline(program,parentFunction,(size_t)__range3,pFVar4);
          program_local._4_4_ = ok;
          bVar1 = true;
        }
        else {
          program_local._4_4_ = failed;
          bVar1 = true;
        }
      }
      else {
LAB_00525e63:
        bVar1 = false;
      }
      pool_ptr<soul::heart::FunctionCall>::~pool_ptr(&local_60);
      if (bVar1) {
        return program_local._4_4_;
      }
      LinkedList<soul::heart::Statement>::Iterator::operator++(&__end3);
    }
    __range3 = (LinkedList<soul::heart::Statement> *)((long)&__range3->firstObject + 1);
  } while( true );
}

Assistant:

static InlineResult inlineNextCall (Program& program, heart::Function& parentFunction, heart::Function& functionToInline)
    {
        for (size_t blockIndex = 0; blockIndex < parentFunction.blocks.size(); ++blockIndex)
        {
            for (auto s : parentFunction.blocks[blockIndex]->statements)
            {
                if (auto call = cast<heart::FunctionCall> (*s))
                {
                    if (call->function == functionToInline)
                    {
                        if (! heart::Utilities::canFunctionBeInlined (program, parentFunction, *call))
                            return InlineResult::failed;

                        makeFunctionCallInline (program, parentFunction, blockIndex, *call);
                        return InlineResult::ok;
                    }
                }
            }
        }

        return InlineResult::noneFound;
    }